

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampler.cpp
# Opt level: O0

void __thiscall
phyr::PixelSampler::PixelSampler(PixelSampler *this,int64_t samplesPerPixel,int nSampledDimensions)

{
  int in_EDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  undefined8 *in_RDI;
  int i;
  value_type *in_stack_ffffffffffffff48;
  Sampler *in_stack_ffffffffffffff50;
  allocator_type *in_stack_ffffffffffffff60;
  undefined8 *__n;
  vector<double,_std::allocator<double>_> *this_00;
  allocator_type local_61 [57];
  int local_28;
  int local_14;
  vector<double,_std::allocator<double>_> *local_10;
  
  local_14 = in_EDX;
  local_10 = in_RSI;
  Sampler::Sampler(in_stack_ffffffffffffff50,(int64_t)in_stack_ffffffffffffff48);
  *in_RDI = &PTR__PixelSampler_0028bb38;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)0x1b8a58);
  std::
  vector<std::vector<phyr::Point2<double>,_std::allocator<phyr::Point2<double>_>_>,_std::allocator<std::vector<phyr::Point2<double>,_std::allocator<phyr::Point2<double>_>_>_>_>
  ::vector((vector<std::vector<phyr::Point2<double>,_std::allocator<phyr::Point2<double>_>_>,_std::allocator<std::vector<phyr::Point2<double>,_std::allocator<phyr::Point2<double>_>_>_>_>
            *)0x1b8a6e);
  in_RDI[0x18] = 0;
  in_RDI[0x19] = 0;
  RNG::RNG((RNG *)(in_RDI + 0x1a));
  for (local_28 = 0; local_28 < local_14; local_28 = local_28 + 1) {
    __n = in_RDI + 0x12;
    this_00 = local_10;
    std::allocator<double>::allocator((allocator<double> *)0x1b8ae2);
    std::vector<double,_std::allocator<double>_>::vector
              (this_00,(size_type)__n,(allocator_type *)in_stack_ffffffffffffff60);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::push_back((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 *)in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff60);
    std::allocator<double>::~allocator((allocator<double> *)0x1b8b1d);
    in_stack_ffffffffffffff50 = (Sampler *)(in_RDI + 0x15);
    in_stack_ffffffffffffff60 = local_61;
    std::allocator<phyr::Point2<double>_>::allocator((allocator<phyr::Point2<double>_> *)0x1b8b49);
    std::vector<phyr::Point2<double>,_std::allocator<phyr::Point2<double>_>_>::vector
              ((vector<phyr::Point2<double>,_std::allocator<phyr::Point2<double>_>_> *)this_00,
               (size_type)__n,in_stack_ffffffffffffff60);
    std::
    vector<std::vector<phyr::Point2<double>,_std::allocator<phyr::Point2<double>_>_>,_std::allocator<std::vector<phyr::Point2<double>,_std::allocator<phyr::Point2<double>_>_>_>_>
    ::push_back((vector<std::vector<phyr::Point2<double>,_std::allocator<phyr::Point2<double>_>_>,_std::allocator<std::vector<phyr::Point2<double>,_std::allocator<phyr::Point2<double>_>_>_>_>
                 *)in_stack_ffffffffffffff50,(value_type *)in_stack_ffffffffffffff48);
    std::vector<phyr::Point2<double>,_std::allocator<phyr::Point2<double>_>_>::~vector
              ((vector<phyr::Point2<double>,_std::allocator<phyr::Point2<double>_>_> *)
               in_stack_ffffffffffffff60);
    std::allocator<phyr::Point2<double>_>::~allocator((allocator<phyr::Point2<double>_> *)0x1b8b84);
  }
  return;
}

Assistant:

PixelSampler::PixelSampler(int64_t samplesPerPixel, int nSampledDimensions)
    : Sampler(samplesPerPixel),
      current1DDimension(0), current2DDimension(0) {
    for (int i = 0; i < nSampledDimensions; i++) {
        samples1D.push_back(std::vector<Real>(samplesPerPixel));
        samples2D.push_back(std::vector<Point2f>(samplesPerPixel));
    }
}